

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_polyfills(CompilerGLSL *this,uint32_t polyfills,bool relaxed)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *qual;
  char *suffix;
  char *local_28;
  char *local_20;
  
  local_28 = "";
  bVar1 = (this->options).es;
  local_20 = "MP";
  if ((int)CONCAT71(in_register_00000011,relaxed) == 0) {
    local_20 = "";
  }
  if (bVar1 == false) {
    local_20 = "";
  }
  if ((bVar1 == true) && (local_28 = "highp ", relaxed)) {
    local_28 = "mediump ";
  }
  if ((polyfills & 1) != 0) {
    statement<char_const*&,char_const(&)[18],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [18])"mat2 spvTranspose",&local_20,(char (*) [2])0x379f10,
               &local_28,(char (*) [8])"mat2 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const(&)[49]>
              (this,(char (*) [49])"return mat2(m[0][0], m[1][0], m[0][1], m[1][1]);");
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  if ((polyfills & 2) != 0) {
    statement<char_const*&,char_const(&)[18],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [18])"mat3 spvTranspose",&local_20,(char (*) [2])0x379f10,
               &local_28,(char (*) [8])"mat3 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const(&)[94]>
              (this,(char (*) [94])
                    "return mat3(m[0][0], m[1][0], m[2][0], m[0][1], m[1][1], m[2][1], m[0][2], m[1][2], m[2][2]);"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  if ((polyfills & 4) != 0) {
    statement<char_const*&,char_const(&)[18],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [18])"mat4 spvTranspose",&local_20,(char (*) [2])0x379f10,
               &local_28,(char (*) [8])"mat4 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const(&)[157]>
              (this,(char (*) [157])
                    "return mat4(m[0][0], m[1][0], m[2][0], m[3][0], m[0][1], m[1][1], m[2][1], m[3][1], m[0][2], m[1][2], m[2][2], m[3][2], m[0][3], m[1][3], m[2][3], m[3][3]);"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  if ((polyfills & 8) != 0) {
    statement<char_const*&,char_const(&)[21],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [21])"float spvDeterminant",&local_20,(char (*) [2])0x379f10
               ,&local_28,(char (*) [8])"mat2 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const(&)[46]>
              (this,(char (*) [46])"return m[0][0] * m[1][1] - m[0][1] * m[1][0];");
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  if ((polyfills & 0x10) != 0) {
    statement<char_const*&,char_const(&)[21],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [21])"float spvDeterminant",&local_20,(char (*) [2])0x379f10
               ,&local_28,(char (*) [8])"mat3 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const(&)[141]>
              (this,(char (*) [141])
                    "return dot(m[0], vec3(m[1][1] * m[2][2] - m[1][2] * m[2][1], m[1][2] * m[2][0] - m[1][0] * m[2][2], m[1][0] * m[2][1] - m[1][1] * m[2][0]));"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  if ((polyfills & 0x20) != 0) {
    statement<char_const*&,char_const(&)[21],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [21])"float spvDeterminant",&local_20,(char (*) [2])0x379f10
               ,&local_28,(char (*) [8])"mat4 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const(&)[740]>
              (this,(char (*) [740])
                    "return dot(m[0], vec4(m[2][1] * m[3][2] * m[1][3] - m[3][1] * m[2][2] * m[1][3] + m[3][1] * m[1][2] * m[2][3] - m[1][1] * m[3][2] * m[2][3] - m[2][1] * m[1][2] * m[3][3] + m[1][1] * m[2][2] * m[3][3], m[3][0] * m[2][2] * m[1][3] - m[2][0] * m[3][2] * m[1][3] - m[3][0] * m[1][2] * m[2][3] + m[1][0] * m[3][2] * m[2][3] + m[2][0] * m[1][2] * m[3][3] - m[1][0] * m[2][2] * m[3][3], m[2][0] * m[3][1] * m[1][3] - m[3][0] * m[2][1] * m[1][3] + m[3][0] * m[1][1] * m[2][3] - m[1][0] * m[3][1] * m[2][3] - m[2][0] * m[1][1] * m[3][3] + m[1][0] * m[2][1] * m[3][3], m[3][0] * m[2][1] * m[1][2] - m[2][0] * m[3][1] * m[1][2] - m[3][0] * m[1][1] * m[2][2] + m[1][0] * m[3][1] * m[2][2] + m[2][0] * m[1][1] * m[3][2] - m[1][0] * m[2][1] * m[3][2]));"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  if ((polyfills & 0x40) != 0) {
    statement<char_const*&,char_const(&)[16],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [16])"mat2 spvInverse",&local_20,(char (*) [2])0x379f10,
               &local_28,(char (*) [8])"mat2 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const(&)[101]>
              (this,(char (*) [101])
                    "return mat2(m[1][1], -m[0][1], -m[1][0], m[0][0]) * (1.0 / (m[0][0] * m[1][1] - m[1][0] * m[0][1]));"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  if ((char)polyfills < '\0') {
    statement<char_const*&,char_const(&)[16],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [16])"mat3 spvInverse",&local_20,(char (*) [2])0x379f10,
               &local_28,(char (*) [8])"mat3 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const*&,char_const(&)[132]>
              (this,&local_28,
               (char (*) [132])
               "vec3 t = vec3(m[1][1] * m[2][2] - m[1][2] * m[2][1], m[1][2] * m[2][0] - m[1][0] * m[2][2], m[1][0] * m[2][1] - m[1][1] * m[2][0]);"
              );
    statement<char_const(&)[288]>
              (this,(char (*) [288])
                    "return mat3(t[0], m[0][2] * m[2][1] - m[0][1] * m[2][2], m[0][1] * m[1][2] - m[0][2] * m[1][1], t[1], m[0][0] * m[2][2] - m[0][2] * m[2][0], m[0][2] * m[1][0] - m[0][0] * m[1][2], t[2], m[0][1] * m[2][0] - m[0][0] * m[2][1], m[0][0] * m[1][1] - m[0][1] * m[1][0]) * (1.0 / dot(m[0], t));"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  if ((polyfills >> 8 & 1) != 0) {
    statement<char_const*&,char_const(&)[16],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&local_28,(char (*) [16])"mat4 spvInverse",&local_20,(char (*) [2])0x379f10,
               &local_28,(char (*) [8])"mat4 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
    this->indent = this->indent + 1;
    statement<char_const*&,char_const(&)[731]>
              (this,&local_28,
               (char (*) [731])
               "vec4 t = vec4(m[2][1] * m[3][2] * m[1][3] - m[3][1] * m[2][2] * m[1][3] + m[3][1] * m[1][2] * m[2][3] - m[1][1] * m[3][2] * m[2][3] - m[2][1] * m[1][2] * m[3][3] + m[1][1] * m[2][2] * m[3][3], m[3][0] * m[2][2] * m[1][3] - m[2][0] * m[3][2] * m[1][3] - m[3][0] * m[1][2] * m[2][3] + m[1][0] * m[3][2] * m[2][3] + m[2][0] * m[1][2] * m[3][3] - m[1][0] * m[2][2] * m[3][3], m[2][0] * m[3][1] * m[1][3] - m[3][0] * m[2][1] * m[1][3] + m[3][0] * m[1][1] * m[2][3] - m[1][0] * m[3][1] * m[2][3] - m[2][0] * m[1][1] * m[3][3] + m[1][0] * m[2][1] * m[3][3], m[3][0] * m[2][1] * m[1][2] - m[2][0] * m[3][1] * m[1][2] - m[3][0] * m[1][1] * m[2][2] + m[1][0] * m[3][1] * m[2][2] + m[2][0] * m[1][1] * m[3][2] - m[1][0] * m[2][1] * m[3][2]);"
              );
    statement<char_const(&)[2208]>
              (this,(char (*) [2208])
                    "return mat4(t[0], m[3][1] * m[2][2] * m[0][3] - m[2][1] * m[3][2] * m[0][3] - m[3][1] * m[0][2] * m[2][3] + m[0][1] * m[3][2] * m[2][3] + m[2][1] * m[0][2] * m[3][3] - m[0][1] * m[2][2] * m[3][3], m[1][1] * m[3][2] * m[0][3] - m[3][1] * m[1][2] * m[0][3] + m[3][1] * m[0][2] * m[1][3] - m[0][1] * m[3][2] * m[1][3] - m[1][1] * m[0][2] * m[3][3] + m[0][1] * m[1][2] * m[3][3], m[2][1] * m[1][2] * m[0][3] - m[1][1] * m[2][2] * m[0][3] - m[2][1] * m[0][2] * m[1][3] + m[0][1] * m[2][2] * m[1][3] + m[1][1] * m[0][2] * m[2][3] - m[0][1] * m[1][2] * m[2][3], t[1], m[2][0] * m[3][2] * m[0][3] - m[3][0] * m[2][2] * m[0][3] + m[3][0] * m[0][2] * m[2][3] - m[0][0] * m[3][2] * m[2][3] - m[2][0] * m[0][2] * m[3][3] + m[0][0] * m[2][2] * m[3][3], m[3][0] * m[1][2] * m[0][3] - m[1][0] * m[3][2] * m[0][3] - m[3][0] * m[0][2] * m[1][3] + m[0][0] * m[3][2] * m[1][3] + m[1][0] * m[0][2] * m[3][3] - m[0][0] * m[1][2] * m[3][3], m[1][0] * m[2][2] * m[0][3] - m[2][0] * m[1][2] * m[0][3] + m[2][0] * m[0][2] * m[1][3] - m[0][0] * m[2][2] * m[1][3] - m[1][0] * m[0][2] * m[2][3] + m[0][0] * m[1][2] * m[2][3], t[2], m[3][0] * m[2][1] * m[0][3] - m[2][0] * m[3][1] * m[0][3] - m[3][0] * m[0][1] * m[2][3] + m[0][0] * m[3][1] * m[2][3] + m[2][0] * m[0][1] * m[3][3] - m[0][0] * m[2][1] * m[3][3], m[1][0] * m[3][1] * m[0][3] - m[3][0] * m[1][1] * m[0][3] + m[3][0] * m[0][1] * m[1][3] - m[0][0] * m[3][1] * m[1][3] - m[1][0] * m[0][1] * m[3][3] + m[0][0] * m[1][1] * m[3][3], m[2][0] * m[1][1] * m[0][3] - m[1][0] * m[2][1] * m[0][3] - m[2][0] * m[0][1] * m[1][3] + m[0][0] * m[2][1] * m[1][3] + m[1][0] * m[0][1] * m[2][3] - m[0][0] * m[1][1] * m[2][3], t[3], m[2][0] * m[3][1] * m[0][2] - m[3][0] * m[2][1] * m[0][2] + m[3][0] * m[0][1] * m[2][2] - m[0][0] * m[3][1] * m[2][2] - m[2][0] * m[0][1] * m[3][2] + m[0][0] * m[2][1] * m[3][2], m[3][0] * m[1][1] * m[0][2] - m[1][0] * m[3][1] * m[0][2] - m[3][0] * m[0][1] * m[1][2] + m[0][0] * m[3][1] * m[1][2] + m[1][0] * m[0][1] * m[3][2] - m[0][0] * m[1][1] * m[3][2], m[1][0] * m[2][1] * m[0][2] - m[2][0] * m[1..." /* TRUNCATED STRING LITERAL */
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x35713a);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_polyfills(uint32_t polyfills, bool relaxed)
{
	const char *qual = "";
	const char *suffix = (options.es && relaxed) ? "MP" : "";
	if (options.es)
		qual = relaxed ? "mediump " : "highp ";

	if (polyfills & PolyfillTranspose2x2)
	{
		statement(qual, "mat2 spvTranspose", suffix, "(", qual, "mat2 m)");
		begin_scope();
		statement("return mat2(m[0][0], m[1][0], m[0][1], m[1][1]);");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillTranspose3x3)
	{
		statement(qual, "mat3 spvTranspose", suffix, "(", qual, "mat3 m)");
		begin_scope();
		statement("return mat3(m[0][0], m[1][0], m[2][0], m[0][1], m[1][1], m[2][1], m[0][2], m[1][2], m[2][2]);");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillTranspose4x4)
	{
		statement(qual, "mat4 spvTranspose", suffix, "(", qual, "mat4 m)");
		begin_scope();
		statement("return mat4(m[0][0], m[1][0], m[2][0], m[3][0], m[0][1], m[1][1], m[2][1], m[3][1], m[0][2], "
		          "m[1][2], m[2][2], m[3][2], m[0][3], m[1][3], m[2][3], m[3][3]);");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillDeterminant2x2)
	{
		statement(qual, "float spvDeterminant", suffix, "(", qual, "mat2 m)");
		begin_scope();
		statement("return m[0][0] * m[1][1] - m[0][1] * m[1][0];");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillDeterminant3x3)
	{
		statement(qual, "float spvDeterminant", suffix, "(", qual, "mat3 m)");
		begin_scope();
		statement("return dot(m[0], vec3(m[1][1] * m[2][2] - m[1][2] * m[2][1], "
		                                "m[1][2] * m[2][0] - m[1][0] * m[2][2], "
		                                "m[1][0] * m[2][1] - m[1][1] * m[2][0]));");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillDeterminant4x4)
	{
		statement(qual, "float spvDeterminant", suffix, "(", qual, "mat4 m)");
		begin_scope();
		statement("return dot(m[0], vec4("
		          "m[2][1] * m[3][2] * m[1][3] - m[3][1] * m[2][2] * m[1][3] + m[3][1] * m[1][2] * m[2][3] - m[1][1] * m[3][2] * m[2][3] - m[2][1] * m[1][2] * m[3][3] + m[1][1] * m[2][2] * m[3][3], "
		          "m[3][0] * m[2][2] * m[1][3] - m[2][0] * m[3][2] * m[1][3] - m[3][0] * m[1][2] * m[2][3] + m[1][0] * m[3][2] * m[2][3] + m[2][0] * m[1][2] * m[3][3] - m[1][0] * m[2][2] * m[3][3], "
		          "m[2][0] * m[3][1] * m[1][3] - m[3][0] * m[2][1] * m[1][3] + m[3][0] * m[1][1] * m[2][3] - m[1][0] * m[3][1] * m[2][3] - m[2][0] * m[1][1] * m[3][3] + m[1][0] * m[2][1] * m[3][3], "
		          "m[3][0] * m[2][1] * m[1][2] - m[2][0] * m[3][1] * m[1][2] - m[3][0] * m[1][1] * m[2][2] + m[1][0] * m[3][1] * m[2][2] + m[2][0] * m[1][1] * m[3][2] - m[1][0] * m[2][1] * m[3][2]));");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillMatrixInverse2x2)
	{
		statement(qual, "mat2 spvInverse", suffix, "(", qual, "mat2 m)");
		begin_scope();
		statement("return mat2(m[1][1], -m[0][1], -m[1][0], m[0][0]) "
		          "* (1.0 / (m[0][0] * m[1][1] - m[1][0] * m[0][1]));");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillMatrixInverse3x3)
	{
		statement(qual, "mat3 spvInverse", suffix, "(", qual, "mat3 m)");
		begin_scope();
		statement(qual, "vec3 t = vec3(m[1][1] * m[2][2] - m[1][2] * m[2][1], m[1][2] * m[2][0] - m[1][0] * m[2][2], m[1][0] * m[2][1] - m[1][1] * m[2][0]);");
		statement("return mat3(t[0], "
		                      "m[0][2] * m[2][1] - m[0][1] * m[2][2], "
		                      "m[0][1] * m[1][2] - m[0][2] * m[1][1], "
		                      "t[1], "
		                      "m[0][0] * m[2][2] - m[0][2] * m[2][0], "
		                      "m[0][2] * m[1][0] - m[0][0] * m[1][2], "
		                      "t[2], "
		                      "m[0][1] * m[2][0] - m[0][0] * m[2][1], "
		                      "m[0][0] * m[1][1] - m[0][1] * m[1][0]) "
		                      "* (1.0 / dot(m[0], t));");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillMatrixInverse4x4)
	{
		statement(qual, "mat4 spvInverse", suffix, "(", qual, "mat4 m)");
		begin_scope();
		statement(qual, "vec4 t = vec4("
		          "m[2][1] * m[3][2] * m[1][3] - m[3][1] * m[2][2] * m[1][3] + m[3][1] * m[1][2] * m[2][3] - m[1][1] * m[3][2] * m[2][3] - m[2][1] * m[1][2] * m[3][3] + m[1][1] * m[2][2] * m[3][3], "
		          "m[3][0] * m[2][2] * m[1][3] - m[2][0] * m[3][2] * m[1][3] - m[3][0] * m[1][2] * m[2][3] + m[1][0] * m[3][2] * m[2][3] + m[2][0] * m[1][2] * m[3][3] - m[1][0] * m[2][2] * m[3][3], "
		          "m[2][0] * m[3][1] * m[1][3] - m[3][0] * m[2][1] * m[1][3] + m[3][0] * m[1][1] * m[2][3] - m[1][0] * m[3][1] * m[2][3] - m[2][0] * m[1][1] * m[3][3] + m[1][0] * m[2][1] * m[3][3], "
		          "m[3][0] * m[2][1] * m[1][2] - m[2][0] * m[3][1] * m[1][2] - m[3][0] * m[1][1] * m[2][2] + m[1][0] * m[3][1] * m[2][2] + m[2][0] * m[1][1] * m[3][2] - m[1][0] * m[2][1] * m[3][2]);");
		statement("return mat4("
		          "t[0], "
		          "m[3][1] * m[2][2] * m[0][3] - m[2][1] * m[3][2] * m[0][3] - m[3][1] * m[0][2] * m[2][3] + m[0][1] * m[3][2] * m[2][3] + m[2][1] * m[0][2] * m[3][3] - m[0][1] * m[2][2] * m[3][3], "
		          "m[1][1] * m[3][2] * m[0][3] - m[3][1] * m[1][2] * m[0][3] + m[3][1] * m[0][2] * m[1][3] - m[0][1] * m[3][2] * m[1][3] - m[1][1] * m[0][2] * m[3][3] + m[0][1] * m[1][2] * m[3][3], "
		          "m[2][1] * m[1][2] * m[0][3] - m[1][1] * m[2][2] * m[0][3] - m[2][1] * m[0][2] * m[1][3] + m[0][1] * m[2][2] * m[1][3] + m[1][1] * m[0][2] * m[2][3] - m[0][1] * m[1][2] * m[2][3], "
		          "t[1], "
		          "m[2][0] * m[3][2] * m[0][3] - m[3][0] * m[2][2] * m[0][3] + m[3][0] * m[0][2] * m[2][3] - m[0][0] * m[3][2] * m[2][3] - m[2][0] * m[0][2] * m[3][3] + m[0][0] * m[2][2] * m[3][3], "
		          "m[3][0] * m[1][2] * m[0][3] - m[1][0] * m[3][2] * m[0][3] - m[3][0] * m[0][2] * m[1][3] + m[0][0] * m[3][2] * m[1][3] + m[1][0] * m[0][2] * m[3][3] - m[0][0] * m[1][2] * m[3][3], "
		          "m[1][0] * m[2][2] * m[0][3] - m[2][0] * m[1][2] * m[0][3] + m[2][0] * m[0][2] * m[1][3] - m[0][0] * m[2][2] * m[1][3] - m[1][0] * m[0][2] * m[2][3] + m[0][0] * m[1][2] * m[2][3], "
		          "t[2], "
		          "m[3][0] * m[2][1] * m[0][3] - m[2][0] * m[3][1] * m[0][3] - m[3][0] * m[0][1] * m[2][3] + m[0][0] * m[3][1] * m[2][3] + m[2][0] * m[0][1] * m[3][3] - m[0][0] * m[2][1] * m[3][3], "
		          "m[1][0] * m[3][1] * m[0][3] - m[3][0] * m[1][1] * m[0][3] + m[3][0] * m[0][1] * m[1][3] - m[0][0] * m[3][1] * m[1][3] - m[1][0] * m[0][1] * m[3][3] + m[0][0] * m[1][1] * m[3][3], "
		          "m[2][0] * m[1][1] * m[0][3] - m[1][0] * m[2][1] * m[0][3] - m[2][0] * m[0][1] * m[1][3] + m[0][0] * m[2][1] * m[1][3] + m[1][0] * m[0][1] * m[2][3] - m[0][0] * m[1][1] * m[2][3], "
		          "t[3], "
		          "m[2][0] * m[3][1] * m[0][2] - m[3][0] * m[2][1] * m[0][2] + m[3][0] * m[0][1] * m[2][2] - m[0][0] * m[3][1] * m[2][2] - m[2][0] * m[0][1] * m[3][2] + m[0][0] * m[2][1] * m[3][2], "
		          "m[3][0] * m[1][1] * m[0][2] - m[1][0] * m[3][1] * m[0][2] - m[3][0] * m[0][1] * m[1][2] + m[0][0] * m[3][1] * m[1][2] + m[1][0] * m[0][1] * m[3][2] - m[0][0] * m[1][1] * m[3][2], "
		          "m[1][0] * m[2][1] * m[0][2] - m[2][0] * m[1][1] * m[0][2] + m[2][0] * m[0][1] * m[1][2] - m[0][0] * m[2][1] * m[1][2] - m[1][0] * m[0][1] * m[2][2] + m[0][0] * m[1][1] * m[2][2]) "
		          "* (1.0 / dot(m[0], t));");
		end_scope();
		statement("");
	}
}